

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<Teacher,_std::allocator<Teacher>_> *
GetRandomSubsetOfTeachers
          (vector<Teacher,_std::allocator<Teacher>_> *__return_storage_ptr__,
          vector<Teacher,_std::allocator<Teacher>_> *teachers)

{
  pointer __first;
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  vector<Teacher,_std::allocator<Teacher>_> local_2740;
  random_device local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  std::vector<Teacher,_std::allocator<Teacher>_>::vector(&local_2740,teachers);
  __first = local_2740.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_2728);
  uVar1 = std::random_device::_M_getval();
  local_13a0._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar2 = local_13a0._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_13a0._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13a0._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<Teacher*,std::vector<Teacher,std::allocator<Teacher>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_>)__first,
             (__normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_>)
             local_2740.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_13a0);
  std::random_device::_M_fini();
  std::vector<Teacher,std::allocator<Teacher>>::
  vector<__gnu_cxx::__normal_iterator<Teacher*,std::vector<Teacher,std::allocator<Teacher>>>,void>
            ((vector<Teacher,std::allocator<Teacher>> *)__return_storage_ptr__,
             (__normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_>)
             local_2740.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_2740.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
             super__Vector_impl_data._M_start + 7,(allocator_type *)&local_13a0);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_2740);
  return __return_storage_ptr__;
}

Assistant:

static vector<Teacher> GetRandomSubsetOfTeachers(const vector<Teacher>& teachers) {
    return GetRandomSubset(teachers, TEACHERS_PER_SUBJECT);
}